

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.h
# Opt level: O2

void __thiscall
slang::ast::SimpleSystemSubroutine::SimpleSystemSubroutine
          (SimpleSystemSubroutine *this,KnownSystemName knownNameId,SubroutineKind kind,
          size_t requiredArgs,
          vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *argTypes,
          Type *returnType,bool isMethod,bool isFirstArgLValue)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,kind);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_005b4090;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&this->argTypes,argTypes);
  this->returnType = returnType;
  this->requiredArgs = requiredArgs;
  this->isMethod = isMethod;
  this->isFirstArgLValue = isFirstArgLValue;
  return;
}

Assistant:

SimpleSystemSubroutine(KnownSystemName knownNameId, SubroutineKind kind, size_t requiredArgs,
                           const std::vector<const Type*>& argTypes, const Type& returnType,
                           bool isMethod, bool isFirstArgLValue = false) :
        SystemSubroutine(knownNameId, kind), argTypes(argTypes), returnType(&returnType),
        requiredArgs(requiredArgs), isMethod(isMethod), isFirstArgLValue(isFirstArgLValue) {
        SLANG_ASSERT(requiredArgs <= argTypes.size());
    }